

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool duckdb::MultiplyPropagateStatistics::Operation<short,duckdb::TryDecimalMultiply>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  bool bVar1;
  short sVar2;
  short sVar3;
  long lVar4;
  BaseStatistics *pBVar5;
  BaseStatistics *pBVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  BaseStatistics *pBVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  short lvals [2];
  short local_84 [2];
  Value *local_80;
  Value *local_78;
  Value local_70;
  
  pBVar6 = lstats;
  local_80 = new_min;
  local_78 = new_max;
  local_84[0] = NumericStats::GetMin<short>(lstats);
  local_84[1] = NumericStats::GetMax<short>(lstats);
  sVar2 = NumericStats::GetMin<short>(rstats);
  sVar3 = NumericStats::GetMax<short>(rstats);
  uVar8 = 0x7fff;
  pBVar10 = (BaseStatistics *)0x8000;
  bVar13 = true;
  lVar4 = 0;
  do {
    uVar7 = (int)sVar2 * (int)local_84[lVar4];
    pBVar6 = (BaseStatistics *)((ulong)pBVar6 & 0xffffffff);
    if ((int)(short)uVar7 == uVar7) {
      pBVar6 = (BaseStatistics *)(ulong)uVar7;
    }
    pBVar5 = (BaseStatistics *)(ulong)uVar8;
    if ((short)pBVar6 < (short)uVar8) {
      pBVar5 = pBVar6;
    }
    uVar9 = (uint)pBVar6;
    if ((short)pBVar6 <= (short)pBVar10) {
      uVar9 = (uint)pBVar10;
    }
    bVar11 = 0x4e1e < uVar7 + 9999;
    if (bVar11) {
      pBVar5 = (BaseStatistics *)(ulong)uVar8;
      uVar9 = (uint)pBVar10;
    }
    uVar8 = (uint)pBVar5;
    pBVar10 = (BaseStatistics *)(ulong)uVar9;
    if (bVar11) {
      bVar11 = false;
    }
    else {
      uVar7 = (int)local_84[lVar4] * (int)sVar3;
      bVar1 = false;
      do {
        bVar11 = bVar1;
        uVar8 = (uint)pBVar5;
        if (bVar11) break;
        if (uVar7 + 0x8000 < 0x10000) {
          pBVar6 = (BaseStatistics *)(ulong)uVar7;
        }
        uVar9 = uVar8;
        if ((short)pBVar6 < (short)pBVar5) {
          uVar9 = (uint)pBVar6;
        }
        pBVar5 = pBVar6;
        if ((short)pBVar6 <= (short)pBVar10) {
          pBVar5 = pBVar10;
        }
        bVar12 = uVar7 + 9999 < 19999;
        if (!bVar12) {
          pBVar5 = pBVar10;
          uVar9 = uVar8;
        }
        uVar8 = uVar9;
        pBVar10 = pBVar5;
        pBVar5 = (BaseStatistics *)(ulong)uVar8;
        bVar1 = true;
      } while (bVar12);
    }
    if (!bVar11) break;
    bVar13 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar13);
  if (bVar13 == false) {
    Value::Numeric(&local_70,type,(long)(short)uVar8);
    Value::operator=(local_80,&local_70);
    Value::~Value(&local_70);
    Value::Numeric(&local_70,type,(long)(short)pBVar10);
    Value::operator=(local_78,&local_70);
    Value::~Value(&local_70);
  }
  return bVar13;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		// statistics propagation on the multiplication is slightly less straightforward because of negative numbers
		// the new min/max depend on the signs of the input types
		// if both are positive the result is [lmin * rmin][lmax * rmax]
		// if lmin/lmax are negative the result is [lmin * rmax][lmax * rmin]
		// etc
		// rather than doing all this switcheroo we just multiply all combinations of lmin/lmax with rmin/rmax
		// and check what the minimum/maximum value is
		T lvals[] {NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(lstats)};
		T rvals[] {NumericStats::GetMin<T>(rstats), NumericStats::GetMax<T>(rstats)};
		T min = NumericLimits<T>::Maximum();
		T max = NumericLimits<T>::Minimum();
		// multiplications
		for (idx_t l = 0; l < 2; l++) {
			for (idx_t r = 0; r < 2; r++) {
				T result;
				if (!OP::Operation(lvals[l], rvals[r], result)) {
					// potential overflow
					return true;
				}
				if (result < min) {
					min = result;
				}
				if (result > max) {
					max = result;
				}
			}
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}